

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_0::testNativeWindow
               (TestLog *log,NativeDisplay *nativeDisplay,NativeWindow *nativeWindow,
               EGLDisplay display,EGLContext context,EGLConfig config,Functions *gl,bool renderColor
               ,int waitFrames,size_t colorCount,Vec4 *colors)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  undefined4 extraout_var;
  EGLSurface pvVar5;
  EGLSurface pvVar6;
  int local_a0;
  bool local_99;
  int colorNdx;
  bool isOk;
  deUint32 program;
  undefined1 local_88 [8];
  TextureLevel result;
  UniqueSurface surface;
  Library *egl;
  bool renderColor_local;
  EGLConfig config_local;
  EGLContext context_local;
  EGLDisplay display_local;
  NativeWindow *nativeWindow_local;
  NativeDisplay *nativeDisplay_local;
  TestLog *log_local;
  Library *egl_00;
  
  iVar2 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  egl_00 = (Library *)CONCAT44(extraout_var,iVar2);
  pvVar5 = eglu::createWindowSurface(nativeDisplay,nativeWindow,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface((UniqueSurface *)&result.m_data.m_cap,egl_00,display,pvVar5);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_88);
  colorNdx = 0;
  local_99 = true;
  do {
    pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)&result.m_data.m_cap);
    pvVar6 = eglu::UniqueSurface::operator*((UniqueSurface *)&result.m_data.m_cap);
    (*egl_00->_vptr_Library[0x27])(egl_00,display,pvVar5,pvVar6,context);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x14d);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  if (renderColor) {
    colorNdx = createGLES2Program(gl,log);
  }
  for (local_a0 = 0; local_a0 < (int)colorCount; local_a0 = local_a0 + 1) {
    if (renderColor) {
      render(gl,colorNdx,colors + local_a0);
    }
    else {
      clear(gl,colors + local_a0);
    }
    do {
      pvVar5 = eglu::UniqueSurface::operator*((UniqueSurface *)&result.m_data.m_cap);
      (*egl_00->_vptr_Library[0x31])(egl_00,display,pvVar5);
      dVar3 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x159);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      (*egl_00->_vptr_Library[0x36])();
      dVar3 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"waitClient()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                       ,0x15a);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    deSleep(waitFrames << 4);
    (*nativeWindow->_vptr_NativeWindow[8])(nativeWindow,local_88);
    bVar1 = validate(log,egl_00,display,config,(TextureLevel *)local_88,colors + local_a0);
    if (!bVar1) {
      local_99 = false;
    }
  }
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,0,0);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                     ,0x162);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_88);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&result.m_data.m_cap);
  return local_99;
}

Assistant:

bool testNativeWindow (TestLog& log, eglu::NativeDisplay& nativeDisplay, eglu::NativeWindow& nativeWindow, EGLDisplay display, EGLContext context, EGLConfig config, const glw::Functions& gl, bool renderColor, int waitFrames, size_t colorCount, const tcu::Vec4* colors)
{
	const Library&		egl			= nativeDisplay.getLibrary();
	eglu::UniqueSurface	surface		(egl, display, eglu::createWindowSurface(nativeDisplay, nativeWindow, display, config, DE_NULL));
	tcu::TextureLevel	result;
	deUint32			program		= 0;
	bool				isOk		= true;

	try
	{
		EGLU_CHECK_CALL(egl, makeCurrent(display, *surface, *surface, context));

		if (renderColor)
			program = createGLES2Program(gl, log);

		for (int colorNdx = 0; colorNdx < (int)colorCount; colorNdx++)
		{
			if (renderColor)
				render(gl, program, colors[colorNdx]);
			else
				clear(gl, colors[colorNdx]);

			EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
			EGLU_CHECK_CALL(egl, waitClient());
			deSleep(waitFrames*16);
			nativeWindow.readScreenPixels(&result);

			if (!validate(log, egl, display, config, result, colors[colorNdx]))
				isOk = false;
		}

		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);
		throw;
	}

	return isOk;
}